

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<float> * __thiscall
cimg_library::CImg<float>::assign
          (CImg<float> *this,float *values,uint size_x,uint size_y,uint size_z,uint size_c)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulongT uVar3;
  ulong uVar4;
  float *pfVar5;
  float *new_data;
  size_t curr_siz;
  size_t siz;
  uint size_c_local;
  uint size_z_local;
  uint size_y_local;
  uint size_x_local;
  float *values_local;
  CImg<float> *this_local;
  
  uVar2 = (ulong)size_x * (ulong)size_y * (ulong)size_z * (ulong)size_c;
  if ((values == (float *)0x0) || (uVar2 == 0)) {
    this_local = assign(this);
  }
  else {
    uVar3 = size(this);
    if ((values == this->_data) && (uVar2 == uVar3)) {
      this_local = assign(this,size_x,size_y,size_z,size_c);
    }
    else {
      this_local = this;
      if ((((this->_is_shared & 1U) == 0) && (this->_data <= values + uVar2)) &&
         (pfVar5 = this->_data, uVar3 = size(this), values < pfVar5 + uVar3)) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar2;
        uVar4 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar4 = 0xffffffffffffffff;
        }
        pfVar5 = (float *)operator_new__(uVar4);
        memcpy(pfVar5,values,uVar2 * 4);
        if (this->_data != (float *)0x0) {
          operator_delete__(this->_data);
        }
        this->_data = pfVar5;
        this->_width = size_x;
        this->_height = size_y;
        this->_depth = size_z;
        this->_spectrum = size_c;
      }
      else {
        assign(this,size_x,size_y,size_z,size_c);
        if ((this->_is_shared & 1U) == 0) {
          memcpy(this->_data,values,uVar2 * 4);
        }
        else {
          memmove(this->_data,values,uVar2 * 4);
        }
      }
    }
  }
  return this_local;
}

Assistant:

CImg<T>& assign(const T *const values, const unsigned int size_x, const unsigned int size_y=1,
                    const unsigned int size_z=1, const unsigned int size_c=1) {
      const size_t siz = (size_t)size_x*size_y*size_z*size_c;
      if (!values || !siz) return assign();
      const size_t curr_siz = (size_t)size();
      if (values==_data && siz==curr_siz) return assign(size_x,size_y,size_z,size_c);
      if (_is_shared || values + siz<_data || values>=_data + size()) {
        assign(size_x,size_y,size_z,size_c);
        if (_is_shared) std::memmove((void*)_data,(void*)values,siz*sizeof(T));
        else std::memcpy((void*)_data,(void*)values,siz*sizeof(T));
      } else {
        T *new_data = 0;
        try { new_data = new T[siz]; } catch (...) {
          _width = _height = _depth = _spectrum = 0; _data = 0;
          throw CImgInstanceException(_cimg_instance
                                      "assign(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      cimg::strbuffersize(sizeof(T)*size_x*size_y*size_z*size_c),
                                      size_x,size_y,size_z,size_c);
        }
        std::memcpy((void*)new_data,(void*)values,siz*sizeof(T));
        delete[] _data; _data = new_data; _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
      }
      return *this;
    }